

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  int iVar2;
  char *pcVar3;
  string *this_00;
  ostringstream ostr;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190 [11];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar2 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar2 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::ostream::_M_insert<long>((long)local_190);
    std::__cxx11::stringbuf::str();
    pcVar3 = AddString(this,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    return pcVar3;
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,var,(allocator<char> *)&local_1b0);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,local_190);
  std::__cxx11::string::~string((string *)local_190);
  if (pcVar3 == (char *)0x0) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_190,var,(allocator<char> *)&local_1b0);
    cmMakefile::MaybeWarnUninitialized(pcVar1,local_190,this->FileName);
    std::__cxx11::string::~string((string *)local_190);
    if (this->RemoveEmpty == false) {
      return (char *)0x0;
    }
    pcVar3 = "";
  }
  else if (this->EscapeQuotes == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,pcVar3,&local_1b1);
    cmSystemTools::EscapeQuotes(local_190,&local_1b0);
    pcVar3 = AddString(this,local_190);
    std::__cxx11::string::~string((string *)local_190);
    this_00 = &local_1b0;
    goto LAB_002daa85;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,pcVar3,(allocator<char> *)&local_1b0);
  pcVar3 = AddString(this,local_190);
  this_00 = local_190;
LAB_002daa85:
  std::__cxx11::string::~string((string *)this_00);
  return pcVar3;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}